

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib552.c
# Opt level: O1

size_t read_callback(void *ptr,size_t size,size_t nmemb,void *stream)

{
  size_t sVar1;
  ulong __n;
  
  sVar1 = current_offset;
  __n = 70000 - current_offset;
  if (size * nmemb < 70000 - current_offset) {
    __n = size * nmemb;
  }
  memcpy(ptr,databuf + current_offset,__n);
  current_offset = sVar1 + __n;
  return __n;
}

Assistant:

static size_t read_callback(void *ptr, size_t size, size_t nmemb, void *stream)
{
  size_t  amount = nmemb * size; /* Total bytes curl wants */
  size_t  available = sizeof(databuf) - current_offset; /* What we have to
                                                           give */
  size_t  given = amount < available ? amount : available; /* What is given */
  (void)stream;
  memcpy(ptr, databuf + current_offset, given);
  current_offset += given;
  return given;
}